

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool __thiscall
cmListFile::ParseFile
          (cmListFile *this,char *filename,cmMessenger *messenger,cmListFileBacktrace *lfbt)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  allocator<char> local_101;
  string local_100;
  cmListFileParser local_e0;
  
  bVar2 = cmsys::SystemTools::FileExists(filename);
  bVar3 = true;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,filename,&local_101);
    bVar3 = cmsys::SystemTools::FileIsDirectory(&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar3 == false) {
    pcVar1 = (char *)(this->Filename)._M_string_length;
    strlen(filename);
    std::__cxx11::string::_M_replace((ulong)&this->Filename,0,pcVar1,(ulong)filename);
    local_e0.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (lfbt->TopEntry).
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_e0.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (lfbt->TopEntry).
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (local_e0.Backtrace.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e0.Backtrace.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_e0.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e0.Backtrace.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_e0.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_e0.ListFile = this;
    local_e0.Messenger = messenger;
    local_e0.FileName = filename;
    local_e0.Lexer = cmListFileLexer_New();
    local_e0.Function.super_cmCommandContext.Name.Lower._M_dataplus._M_p =
         (pointer)&local_e0.Function.super_cmCommandContext.Name.Lower.field_2;
    local_e0.Function.super_cmCommandContext.Name.Lower._M_string_length = 0;
    local_e0.Function.super_cmCommandContext.Name.Lower.field_2._M_local_buf[0] = '\0';
    local_e0.Function.super_cmCommandContext.Name.Original._M_dataplus._M_p =
         (pointer)&local_e0.Function.super_cmCommandContext.Name.Original.field_2;
    local_e0.Function.super_cmCommandContext.Name.Original._M_string_length = 0;
    local_e0.Function.super_cmCommandContext.Name.Original.field_2._M_local_buf[0] = '\0';
    local_e0.Function.super_cmCommandContext.Line = 0;
    local_e0.Function.super_cmCommandContext.Col = 0;
    local_e0.Function.super_cmCommandContext.EndLine = 0;
    local_e0.Function.super_cmCommandContext.EndCol = 0;
    local_e0.Function.Arguments.
    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e0.Function.Arguments.
    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e0.Function.Arguments.
    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = cmListFileParser::ParseFile(&local_e0);
    cmListFileParser::~cmListFileParser(&local_e0);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmListFile::ParseFile(const char* filename, cmMessenger* messenger,
                           cmListFileBacktrace const& lfbt)
{
  if (!cmSystemTools::FileExists(filename) ||
      cmSystemTools::FileIsDirectory(filename)) {
    return false;
  }

  Filename = filename;

  bool parseError = false;

  {
    cmListFileParser parser(this, lfbt, messenger, filename);
    parseError = !parser.ParseFile();
  }

  return !parseError;
}